

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

int Str_MuxDelayEdge_rec(Str_Mux_t *pMux,int i)

{
  int iVar1;
  Str_Mux_t *pMux_00;
  Str_Mux_t *pFanin;
  int i_local;
  Str_Mux_t *pMux_local;
  
  if (0 < pMux->Edge[i].Fan) {
    pMux_00 = Str_MuxFanin(pMux,i);
    Str_MuxDelayEdge_rec(pMux_00,0);
    Str_MuxDelayEdge_rec(pMux_00,1);
    iVar1 = Str_Delay3(pMux_00->Edge[0].FanDel,pMux_00->Edge[1].FanDel,pMux_00->Edge[2].FanDel,
                       pMux_00->nLutSize);
    pMux->Edge[i].FanDel = iVar1;
  }
  return pMux->Edge[i].FanDel;
}

Assistant:

int Str_MuxDelayEdge_rec( Str_Mux_t * pMux, int i )
{
    if ( pMux->Edge[i].Fan > 0 )
    {
        Str_Mux_t * pFanin = Str_MuxFanin( pMux, i );
        Str_MuxDelayEdge_rec( pFanin, 0 );
        Str_MuxDelayEdge_rec( pFanin, 1 );
        pMux->Edge[i].FanDel = Str_Delay3( pFanin->Edge[0].FanDel, pFanin->Edge[1].FanDel, pFanin->Edge[2].FanDel, pFanin->nLutSize );
    }
    return pMux->Edge[i].FanDel;
}